

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::NegativeCompileInterpolationCase::iterate
          (NegativeCompileInterpolationCase *this)

{
  bool bVar1;
  RenderContext *renderCtx;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  string *source_00;
  MessageBuilder local_6f0;
  MessageBuilder local_570;
  LogKernelSource local_3f0;
  MessageBuilder local_3d0;
  LogKernelSource local_250;
  MessageBuilder local_230;
  char *local_b0;
  char *sourceStrPtr;
  undefined1 local_98 [8];
  Shader shader;
  string source;
  NegativeCompileInterpolationCase *this_local;
  
  (anonymous_namespace)::NegativeCompileInterpolationCase::genShaderSource_abi_cxx11_
            ((string *)&shader.m_info.compileTimeUs,this);
  renderCtx = Context::getRenderContext((this->super_TestCase).m_context);
  glu::Shader::Shader((Shader *)local_98,renderCtx,SHADERTYPE_FRAGMENT);
  local_b0 = (char *)std::__cxx11::string::c_str();
  pTVar2 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_230,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_230,(char (*) [24])"Fragment shader source:");
  pTVar2 = tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::LogKernelSource::LogKernelSource(&local_250,(string *)&shader.m_info.compileTimeUs);
  tcu::TestLog::operator<<(pTVar2,&local_250);
  tcu::LogKernelSource::~LogKernelSource(&local_250);
  tcu::MessageBuilder::~MessageBuilder(&local_230);
  glu::Shader::setSources((Shader *)local_98,1,&local_b0,(int *)0x0);
  glu::Shader::compile((Shader *)local_98);
  pTVar2 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_3d0,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_3d0,(char (*) [10])"Info log:");
  pTVar2 = tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  source_00 = glu::Shader::getInfoLog_abi_cxx11_((Shader *)local_98);
  tcu::LogKernelSource::LogKernelSource(&local_3f0,source_00);
  tcu::TestLog::operator<<(pTVar2,&local_3f0);
  tcu::LogKernelSource::~LogKernelSource(&local_3f0);
  tcu::MessageBuilder::~MessageBuilder(&local_3d0);
  bVar1 = glu::Shader::getCompileStatus((Shader *)local_98);
  if (bVar1) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_570,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_570,(char (*) [45])"ERROR: Illegal shader compiled successfully.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_570);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Unexpected compile status");
  }
  else {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_6f0,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_6f0,(char (*) [28])"Compile failed as expected.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_6f0);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  glu::Shader::~Shader((Shader *)local_98);
  std::__cxx11::string::~string((string *)&shader.m_info.compileTimeUs);
  return STOP;
}

Assistant:

NegativeCompileInterpolationCase::IterateResult NegativeCompileInterpolationCase::iterate (void)
{
	const std::string	source			= genShaderSource();
	glu::Shader			shader			(m_context.getRenderContext(), glu::SHADERTYPE_FRAGMENT);
	const char* const	sourceStrPtr	= source.c_str();

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "Fragment shader source:"
						<< tcu::TestLog::EndMessage
						<< tcu::TestLog::KernelSource(source);

	shader.setSources(1, &sourceStrPtr, DE_NULL);
	shader.compile();

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "Info log:"
						<< tcu::TestLog::EndMessage
						<< tcu::TestLog::KernelSource(shader.getInfoLog());

	if (shader.getCompileStatus())
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "ERROR: Illegal shader compiled successfully." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected compile status");
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Compile failed as expected." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	return STOP;
}